

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O1

void __thiscall Clasp::SatPreprocessor::freezeSeen(SatPreprocessor *this)

{
  uint32 *puVar1;
  byte bVar2;
  uint uVar3;
  SharedContext *pSVar4;
  pointer puVar5;
  pointer pVVar6;
  uint uVar7;
  
  pSVar4 = this->ctx_;
  uVar7 = (pSVar4->varInfo_).ebo_.size;
  if (uVar7 <= (this->seen_).lo) {
    (this->seen_).lo = 1;
  }
  if (uVar7 <= (this->seen_).hi) {
    (this->seen_).hi = uVar7;
  }
  uVar7 = (this->seen_).lo;
  uVar3 = (this->seen_).hi;
  if (uVar7 != uVar3) {
    puVar5 = ((*(pSVar4->solvers_).ebo_.buf)->assign_).assign_.ebo_.buf;
    do {
      if ((uVar7 != 0) && (puVar5[uVar7] < 0xfffffff0)) {
        pVVar6 = (pSVar4->varInfo_).ebo_.buf;
        bVar2 = pVVar6[uVar7].rep;
        if ((bVar2 & 0x40) == 0) {
          pVVar6[uVar7].rep = bVar2 | 0x40;
          puVar1 = &(pSVar4->stats_).vars.frozen;
          *puVar1 = *puVar1 + 1;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
  }
  (this->seen_).lo = uVar3;
  return;
}

Assistant:

void SatPreprocessor::freezeSeen() {
	if (!ctx_->validVar(seen_.lo)) { seen_.lo = 1; }
	if (!ctx_->validVar(seen_.hi)) { seen_.hi = ctx_->numVars() + 1; }
	for (Var v = seen_.lo; v != seen_.hi; ++v) {
		if (!ctx_->eliminated(v)) { ctx_->setFrozen(v, true); }
	}
	seen_.lo = seen_.hi;
}